

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

Own<capnp::SchemaFile,_std::nullptr_t>
capnp::SchemaFile::newFromDirectory
          (ReadableDirectory *baseDir,Path *path,
          ArrayPtr<const_kj::ReadableDirectory_*const> importPath,
          Maybe<kj::String> *displayNameOverride)

{
  Path *pPVar1;
  Path *params_1;
  Maybe<kj::String> *pMVar2;
  SchemaFile *extraout_RDX;
  Maybe<kj::String> *in_R9;
  Own<capnp::SchemaFile,_std::nullptr_t> OVar3;
  PathPtr path_00;
  PathPtr local_68;
  Own<const_kj::ReadableFile,_std::nullptr_t> local_58;
  undefined1 local_48 [24];
  Maybe<kj::String> *displayNameOverride_local;
  Path *path_local;
  ReadableDirectory *baseDir_local;
  ArrayPtr<const_kj::ReadableDirectory_*const> importPath_local;
  
  baseDir_local = (ReadableDirectory *)importPath.size_;
  pMVar2 = (Maybe<kj::String> *)importPath.ptr;
  displayNameOverride_local = pMVar2;
  path_local = path;
  importPath_local.ptr = (ReadableDirectory **)displayNameOverride;
  importPath_local.size_ = (size_t)baseDir;
  params_1 = kj::mv<kj::Path>((Path *)pMVar2);
  pPVar1 = path_local;
  kj::PathPtr::PathPtr(&local_68,(Path *)pMVar2);
  path_00.parts.size_ = (size_t)local_68.parts.ptr;
  path_00.parts.ptr = (String *)pPVar1;
  kj::ReadableDirectory::openFile((ReadableDirectory *)&local_58,path_00);
  pMVar2 = kj::mv<kj::Maybe<kj::String>>(in_R9);
  kj::
  heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::Maybe<kj::String>>
            ((kj *)local_48,(ReadableDirectory *)path,params_1,
             (ArrayPtr<const_kj::ReadableDirectory_*const> *)&baseDir_local,&local_58,pMVar2);
  kj::Own<capnp::SchemaFile,decltype(nullptr)>::Own<capnp::SchemaFile::DiskSchemaFile,void>
            ((Own<capnp::SchemaFile,decltype(nullptr)> *)baseDir,
             (Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> *)local_48);
  kj::Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t>::~Own
            ((Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> *)local_48);
  kj::Own<const_kj::ReadableFile,_std::nullptr_t>::~Own(&local_58);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)baseDir;
  return OVar3;
}

Assistant:

kj::Own<SchemaFile> SchemaFile::newFromDirectory(
    const kj::ReadableDirectory& baseDir, kj::Path path,
    kj::ArrayPtr<const kj::ReadableDirectory* const> importPath,
    kj::Maybe<kj::String> displayNameOverride) {
  return kj::heap<DiskSchemaFile>(baseDir, kj::mv(path), importPath, baseDir.openFile(path),
                                  kj::mv(displayNameOverride));
}